

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::LowerInclusiveBetweenOperator,false,true,false>
                (string_t *adata,string_t *bdata,string_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  anon_union_16_2_67f50693_for_value local_40;
  
  if (count == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      if (result_sel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)result_sel->sel_vector[uVar7];
      }
      uVar3 = uVar7;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)asel->sel_vector[uVar7];
      }
      uVar8 = uVar7;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)bsel->sel_vector[uVar7];
      }
      uVar5 = uVar7;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)csel->sel_vector[uVar7];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0))
          && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))))
         && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0))))
      {
        local_40._0_8_ = *(undefined8 *)&adata[uVar3].value;
        local_40.pointer.ptr = adata[uVar3].value.pointer.ptr;
        local_50._0_8_ = *(undefined8 *)&bdata[uVar8].value;
        local_50.pointer.ptr = bdata[uVar8].value.pointer.ptr;
        local_60._0_8_ = *(undefined8 *)&cdata[uVar5].value;
        local_60.pointer.ptr = cdata[uVar5].value.pointer.ptr;
        bVar2 = string_t::StringComparisonOperators::GreaterThan
                          ((string_t *)&local_50.pointer,(string_t *)&local_40.pointer);
        if (bVar2) {
          uVar3 = 0;
        }
        else {
          bVar2 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_60.pointer,(string_t *)&local_40.pointer);
          uVar3 = (ulong)bVar2;
        }
      }
      else {
        uVar3 = 0;
      }
      true_sel->sel_vector[iVar4] = (sel_t)uVar6;
      iVar4 = uVar3 + iVar4;
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
  }
  return iVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}